

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

OsStackTraceGetterInterface * __thiscall
testing::internal::UnitTestImpl::os_stack_trace_getter(UnitTestImpl *this)

{
  OsStackTraceGetter *this_00;
  
  this_00 = (OsStackTraceGetter *)this->os_stack_trace_getter_;
  if (this_00 == (OsStackTraceGetter *)0x0) {
    this_00 = (OsStackTraceGetter *)operator_new(0x40);
    OsStackTraceGetter::OsStackTraceGetter(this_00);
    this->os_stack_trace_getter_ = (OsStackTraceGetterInterface *)this_00;
  }
  return &this_00->super_OsStackTraceGetterInterface;
}

Assistant:

OsStackTraceGetterInterface* UnitTestImpl::os_stack_trace_getter() {
  if (os_stack_trace_getter_ == NULL) {
    os_stack_trace_getter_ = new OsStackTraceGetter;
  }

  return os_stack_trace_getter_;
}